

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxShape.h
# Opt level: O0

void __thiscall btBoxShape::getEdge(btBoxShape *this,int i,btVector3 *pa,btVector3 *pb)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  int edgeVert1;
  int edgeVert0;
  undefined4 local_28;
  undefined4 local_24;
  
  local_24 = 0;
  local_28 = 0;
  switch(in_ESI) {
  case 0:
    local_24 = 0;
    local_28 = 1;
    break;
  case 1:
    local_24 = 0;
    local_28 = 2;
    break;
  case 2:
    local_24 = 1;
    local_28 = 3;
    break;
  case 3:
    local_24 = 2;
    local_28 = 3;
    break;
  case 4:
    local_24 = 0;
    local_28 = 4;
    break;
  case 5:
    local_24 = 1;
    local_28 = 5;
    break;
  case 6:
    local_24 = 2;
    local_28 = 6;
    break;
  case 7:
    local_24 = 3;
    local_28 = 7;
    break;
  case 8:
    local_24 = 4;
    local_28 = 5;
    break;
  case 9:
    local_24 = 4;
    local_28 = 6;
    break;
  case 10:
    local_24 = 5;
    local_28 = 7;
    break;
  case 0xb:
    local_24 = 6;
    local_28 = 7;
  }
  (**(code **)(*in_RDI + 0xd8))(in_RDI,local_24,in_RDX);
  (**(code **)(*in_RDI + 0xd8))(in_RDI,local_28,in_RCX);
  return;
}

Assistant:

virtual void getEdge(int i,btVector3& pa,btVector3& pb) const
	//virtual void getEdge(int i,Edge& edge) const
	{
		int edgeVert0 = 0;
		int edgeVert1 = 0;

		switch (i)
		{
		case 0:
				edgeVert0 = 0;
				edgeVert1 = 1;
			break;
		case 1:
				edgeVert0 = 0;
				edgeVert1 = 2;
			break;
		case 2:
			edgeVert0 = 1;
			edgeVert1 = 3;

			break;
		case 3:
			edgeVert0 = 2;
			edgeVert1 = 3;
			break;
		case 4:
			edgeVert0 = 0;
			edgeVert1 = 4;
			break;
		case 5:
			edgeVert0 = 1;
			edgeVert1 = 5;

			break;
		case 6:
			edgeVert0 = 2;
			edgeVert1 = 6;
			break;
		case 7:
			edgeVert0 = 3;
			edgeVert1 = 7;
			break;
		case 8:
			edgeVert0 = 4;
			edgeVert1 = 5;
			break;
		case 9:
			edgeVert0 = 4;
			edgeVert1 = 6;
			break;
		case 10:
			edgeVert0 = 5;
			edgeVert1 = 7;
			break;
		case 11:
			edgeVert0 = 6;
			edgeVert1 = 7;
			break;
		default:
			btAssert(0);

		}

		getVertex(edgeVert0,pa );
		getVertex(edgeVert1,pb );
	}